

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_loader_c(lua_State *L)

{
  int iVar1;
  char *name_00;
  char *pcVar2;
  lua_State *in_RDI;
  int unaff_retaddr;
  char *filename;
  char *name;
  char *in_stack_ffffffffffffffe0;
  size_t *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  name_00 = luaL_checklstring((lua_State *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8);
  pcVar2 = findfile(in_RDI,name_00,in_stack_ffffffffffffffe0);
  if ((pcVar2 != (char *)0x0) && (iVar1 = ll_loadfunc(L,name,filename,unaff_retaddr), iVar1 != 0)) {
    loaderror(in_RDI,name_00);
  }
  return 1;
}

Assistant:

static int lj_cf_package_loader_c(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  const char *filename = findfile(L, name, "cpath");
  if (filename == NULL) return 1;  /* library not found in this path */
  if (ll_loadfunc(L, filename, name, 0) != 0)
    loaderror(L, filename);
  return 1;  /* library loaded successfully */
}